

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Expression * __thiscall
wasm::Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::replaceCurrent
          (Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_> *this,
          Expression *expression)

{
  Function *pFVar1;
  Expression *pEVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  undefined8 uVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false> __it
  ;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  DebugLocation location;
  Expression *expression_local;
  
  pFVar1 = this->currFunction;
  unique0x100001f9 = expression;
  if ((pFVar1 != (Function *)0x0) && ((pFVar1->debugLocations)._M_h._M_element_count != 0)) {
    pEVar2 = *this->replacep;
    uVar3 = (pFVar1->debugLocations)._M_h._M_bucket_count;
    uVar7 = (ulong)pEVar2 % uVar3;
    p_Var8 = (pFVar1->debugLocations)._M_h._M_buckets[uVar7];
    p_Var9 = (__node_base_ptr)0x0;
    if ((p_Var8 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var8->_M_nxt, p_Var9 = p_Var8, pEVar2 != (Expression *)p_Var8->_M_nxt[1]._M_nxt))
    {
      while (p_Var8 = p_Var4, p_Var4 = p_Var8->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var9 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar3 != uVar7) ||
           (p_Var9 = p_Var8, pEVar2 == (Expression *)p_Var4[1]._M_nxt)) goto LAB_00795e66;
      }
      p_Var9 = (__node_base_ptr)0x0;
    }
LAB_00795e66:
    if (p_Var9 == (__node_base_ptr)0x0) {
      __it._M_cur = (__node_type *)0x0;
    }
    else {
      __it._M_cur = (__node_type *)p_Var9->_M_nxt;
    }
    if (__it._M_cur != (__node_type *)0x0) {
      location.fileIndex = *(BinaryLocation *)((long)__it._M_cur + 0x18);
      uVar5 = *(undefined8 *)((long)__it._M_cur + 0x10);
      std::
      _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(pFVar1->debugLocations)._M_h,(const_iterator)__it._M_cur);
      pmVar6 = std::__detail::
               _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pFVar1->debugLocations,(key_type *)&location.columnNumber);
      pmVar6->fileIndex = (int)uVar5;
      pmVar6->lineNumber = (int)((ulong)uVar5 >> 0x20);
      pmVar6->columnNumber = location.fileIndex;
    }
  }
  *this->replacep = stack0xffffffffffffffe0;
  return stack0xffffffffffffffe0;
}

Assistant:

Expression* replaceCurrent(Expression* expression) {
    // Copy debug info, if present.
    if (currFunction) {
      auto& debugLocations = currFunction->debugLocations;
      if (!debugLocations.empty()) {
        auto* curr = getCurrent();
        auto iter = debugLocations.find(curr);
        if (iter != debugLocations.end()) {
          auto location = iter->second;
          debugLocations.erase(iter);
          debugLocations[expression] = location;
        }
      }
    }
    return *replacep = expression;
  }